

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_23::EscapeAnalyzer::applyOldInteractionToReplacement
          (EscapeAnalyzer *this,Expression *old,Expression *rep)

{
  unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
  *this_00;
  mapped_type mVar1;
  __node_ptr p_Var2;
  mapped_type *pmVar3;
  Expression *local_28;
  Expression *old_local;
  Expression *rep_local;
  
  this_00 = &this->reachedInteractions;
  local_28 = old;
  old_local = rep;
  p_Var2 = std::
           _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,
                          (ulong)old % (this->reachedInteractions)._M_h._M_bucket_count,&local_28,
                          (__hash_code)&local_28);
  if (p_Var2 != (__node_ptr)0x0) {
    if ((rep->type).id != 1) {
      pmVar3 = std::
               unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
               ::operator[](this_00,&local_28);
      mVar1 = *pmVar3;
      pmVar3 = std::
               unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
               ::operator[](this_00,&old_local);
      *pmVar3 = mVar1;
    }
    return;
  }
  __assert_fail("reachedInteractions.count(old)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                ,0x21d,
                "void wasm::(anonymous namespace)::EscapeAnalyzer::applyOldInteractionToReplacement(Expression *, Expression *)"
               );
}

Assistant:

void applyOldInteractionToReplacement(Expression* old, Expression* rep) {
    // We can only replace something relevant that we found in the analysis.
    // (Not only would anything else be invalid to process, but also we wouldn't
    // know what interaction to give the replacement.)
    assert(reachedInteractions.count(old));

    // The replacement should have the same interaction as the thing it
    // replaces, since it is a drop-in replacement for it. The one exception is
    // when we replace with something unreachable, which is the result of us
    // figuring out that some code will trap at runtime. In that case, we've
    // made the code unreachable and the allocation does not interact with that
    // code at all.
    if (rep->type != Type::unreachable) {
      reachedInteractions[rep] = reachedInteractions[old];
    }
  }